

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O0

void small_alloc_basic(void)

{
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n","small_alloc_basic");
  small_alloc_test(0xc,5000,1000,0x400,5000);
  _ok(1,"true",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",0x75,
      "line %d");
  _space(_stdout);
  printf("# *** %s: done ***\n","small_alloc_basic");
  check_plan();
  return;
}

Assistant:

static void
small_alloc_basic(void)
{
	plan(1);
	header();

	small_alloc_test(OBJSIZE_MIN, 5000, 1000, 1024, 5000);
	ok(true);

	footer();
	check_plan();
}